

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

uint32_t __thiscall cfd::core::Psbt::GetTxOutCount(Psbt *this)

{
  CfdException *pCVar1;
  allocator local_a1;
  string local_a0;
  CfdSourceLocation local_80;
  undefined1 local_65;
  allocator local_51;
  string local_50;
  CfdSourceLocation local_30;
  void *local_18;
  wally_psbt *psbt_pointer;
  Psbt *this_local;
  
  local_18 = this->wally_psbt_pointer_;
  psbt_pointer = (wally_psbt *)this;
  if (local_18 == (void *)0x0) {
    local_30.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_30.filename = local_30.filename + 1;
    local_30.line = 0x87e;
    local_30.funcname = "GetTxOutCount";
    logger::warn<>(&local_30,"psbt pointer is null");
    local_65 = 1;
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_50,"psbt pointer is null.",&local_51);
    CfdException::CfdException(pCVar1,kCfdIllegalStateError,&local_50);
    local_65 = 0;
    __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (*(long *)((long)local_18 + 8) == 0) {
    local_80.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_80.filename = local_80.filename + 1;
    local_80.line = 0x881;
    local_80.funcname = "GetTxOutCount";
    logger::warn<>(&local_80,"psbt base tx is null");
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_a0,"psbt base tx is null.",&local_a1);
    CfdException::CfdException(pCVar1,kCfdIllegalStateError,&local_a0);
    __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  return (uint32_t)*(undefined8 *)(*(long *)((long)local_18 + 8) + 0x28);
}

Assistant:

uint32_t Psbt::GetTxOutCount() const {
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  if (psbt_pointer == nullptr) {
    warn(CFD_LOG_SOURCE, "psbt pointer is null");
    throw CfdException(kCfdIllegalStateError, "psbt pointer is null.");
  } else if (psbt_pointer->tx == nullptr) {
    warn(CFD_LOG_SOURCE, "psbt base tx is null");
    throw CfdException(kCfdIllegalStateError, "psbt base tx is null.");
  }
  return static_cast<uint32_t>(psbt_pointer->tx->num_outputs);
}